

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_SetupFrame(AActor *actor)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint32 uVar4;
  subsector_t *psVar5;
  secplane_t *psVar6;
  TArray<lightlist_t,_lightlist_t> *this;
  lightlist_t *plVar7;
  sector_t_conflict *psVar8;
  float fVar9;
  double dVar10;
  DWORD local_238;
  DWORD local_234;
  lightlist_t *local_230;
  int local_21c;
  double local_200;
  int local_1f0;
  uint local_1ec;
  int hom;
  int color;
  sector_t *s;
  PalEntry blendv;
  int viewside;
  secplane_t *plane;
  uint i;
  TArray<lightlist_t,_lightlist_t> *lightlist;
  double local_1b0;
  double power_1;
  Vector2 local_1a0;
  double local_190;
  double power;
  DAngle an;
  double quakefactor;
  FQuakeJiggers jiggers;
  double theZ_1;
  double local_e0;
  double theZ;
  undefined1 local_c0 [40];
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  TAngle<double> local_68;
  DAngle camangle;
  DVector3 campos;
  sector_t *oldsector;
  int nowtic;
  bool unlinked;
  InterpolationViewer *iview;
  player_t *ppStack_18;
  uint newblend;
  player_t *player;
  AActor *actor_local;
  
  player = (player_t *)actor;
  if (actor == (AActor *)0x0) {
    I_Error("Tried to render from a NULL actor.");
  }
  ppStack_18 = (player_t *)(player->weapons).Slots[5].Weapons.Array;
  oldsector._7_1_ = 0;
  if ((ppStack_18 == (player_t *)0x0) || (ppStack_18->mo != (APlayerPawn *)player)) {
    camera = (AActor *)player;
  }
  else {
    camera = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&ppStack_18->camera);
    if (camera == (AActor *)0x0) {
      camera = TObjPtr<AActor>::operator=(&ppStack_18->camera,&ppStack_18->mo->super_AActor);
    }
  }
  if (camera == (AActor *)0x0) {
    I_Error("You lost your body. Bad dehacked work is likely to blame.");
  }
  _nowtic = FindPastViewer(camera);
  oldsector._0_4_ = (*I_GetTime)(false);
  if ((_nowtic->otic != -1) && (_nowtic->otic < (int)oldsector)) {
    _nowtic->otic = (int)oldsector;
    InterpolationViewer::instance::operator=(&_nowtic->Old,&_nowtic->New);
  }
  if (((ppStack_18 == (player_t *)0x0) || (gamestate == GS_TITLELEVEL)) ||
     (((ppStack_18->cheats & 0x20U) == 0 &&
      ((bVar1 = FBoolCVar::operator_cast_to_bool(&r_deathcamera), !bVar1 || (0 < camera->health)))))
     ) {
    AActor::Pos((DVector3 *)&theZ,camera);
    TVector3<double>::XY((TVector3<double> *)local_c0);
    if (camera->player == (player_t *)0x0) {
      local_200 = AActor::Z(camera);
      dVar10 = AActor::GetCameraHeight(camera);
      local_200 = local_200 + dVar10;
    }
    else {
      local_200 = camera->player->viewz;
    }
    TVector3<double>::TVector3((TVector3<double> *)(local_c0 + 0x10),(Vector2 *)local_c0,local_200);
    TVector3<double>::operator=(&(_nowtic->New).Pos,(TVector3<double> *)(local_c0 + 0x10));
    viewsector = camera->Sector;
    r_showviewer = false;
  }
  else {
    TVector2<double>::TVector2((TVector2<double> *)&campos.Z,&(_nowtic->Old).Pos);
    psVar5 = R_PointInSubsector((DVector2 *)&campos.Z);
    psVar8 = psVar5->sector;
    TVector3<double>::TVector3((TVector3<double> *)&camangle);
    TAngle<double>::TAngle(&local_68);
    P_AimCamera(camera,(DVector3 *)&camangle,&local_68,(sector_t_conflict **)&viewsector,
                (bool *)((long)&oldsector + 7));
    TVector3<double>::operator=(&(_nowtic->New).Pos,(TVector3<double> *)&camangle);
    TAngle<double>::operator=(&(_nowtic->New).Angles.Yaw,&local_68);
    r_showviewer = true;
    bVar1 = true;
    if ((viewsector->PortalGroup == psVar8->PortalGroup) &&
       (bVar1 = false, (oldsector._7_1_ & 1) != 0)) {
      TVector3<double>::XY((TVector3<double> *)local_88);
      TVector3<double>::XY((TVector3<double> *)local_98);
      TVector2<double>::operator-
                ((TVector2<double> *)(local_88 + 0x10),(TVector2<double> *)local_88);
      dVar10 = TVector2<double>::LengthSquared((TVector2<double> *)(local_88 + 0x10));
      bVar1 = 65536.0 < dVar10;
    }
    if (bVar1) {
      _nowtic->otic = (int)oldsector;
      InterpolationViewer::instance::operator=(&_nowtic->Old,&_nowtic->New);
      r_NoInterpolate = true;
    }
  }
  TRotator<double>::operator=(&(_nowtic->New).Angles,&camera->Angles);
  if (camera->player != (player_t *)0x0) {
    ppStack_18 = camera->player;
  }
  if ((_nowtic->otic == -1) || ((r_NoInterpolate & 1U) != 0)) {
    R_ResetViewInterpolation();
    _nowtic->otic = (int)oldsector;
  }
  r_TicFracF = I_GetTimeFrac(&r_FrameTime);
  bVar1 = FBoolCVar::operator_cast_to_bool(&cl_capfps);
  if ((bVar1) || ((r_NoInterpolate & 1U) != 0)) {
    r_TicFracF = 1.0;
  }
  R_InterpolateView(ppStack_18,r_TicFracF,_nowtic);
  R_SetViewAngle();
  FInterpolator::DoInterpolations(&interpolator,r_TicFracF);
  bVar1 = sector_t::PortalBlocksMovement(viewsector,1);
  if (bVar1) {
    psVar6 = &viewsector->ceilingplane;
    TVector2<double>::TVector2((TVector2<double> *)&theZ_1,&ViewPos);
    local_e0 = secplane_t::ZatPoint(psVar6,(DVector2 *)&theZ_1);
    local_e0 = local_e0 - 4.0;
    if (local_e0 < ViewPos.Z) {
      ViewPos.Z = local_e0;
    }
  }
  bVar1 = sector_t::PortalBlocksMovement(viewsector,0);
  if (bVar1) {
    psVar6 = &viewsector->floorplane;
    TVector2<double>::TVector2((TVector2<double> *)&jiggers.RollWave,&ViewPos);
    dVar10 = secplane_t::ZatPoint(psVar6,(DVector2 *)&jiggers.RollWave);
    if (ViewPos.Z < dVar10 + 4.0) {
      ViewPos.Z = dVar10 + 4.0;
    }
  }
  if (paused == 0) {
    FQuakeJiggers::FQuakeJiggers((FQuakeJiggers *)&quakefactor);
    memset(&quakefactor,0,0x70);
    iVar2 = DEarthquake::StaticGetQuakeIntensities(camera,(FQuakeJiggers *)&quakefactor);
    if (0 < iVar2) {
      fVar9 = FFloatCVar::operator_cast_to_float(&r_quakeintensity);
      an.Degrees = (double)fVar9;
      TAngle<double>::TAngle((TAngle<double> *)&power);
      if ((((jiggers.RelOffset.Z != 0.0) || (NAN(jiggers.RelOffset.Z))) ||
          (jiggers.RollIntensity != 0.0)) || (NAN(jiggers.RollIntensity))) {
        dVar10 = QuakePower(an.Degrees,jiggers.RelOffset.Z,jiggers.RollIntensity);
        TAngle<double>::operator+=(&ViewRoll,dVar10);
      }
      if (((jiggers.Intensity.Z != 0.0) || (NAN(jiggers.Intensity.Z))) ||
         ((jiggers.Offset.Z != 0.0 || (NAN(jiggers.Offset.Z))))) {
        TAngle<double>::operator=((TAngle<double> *)&power,&(camera->Angles).Yaw);
        local_190 = QuakePower(an.Degrees,jiggers.Intensity.Z,jiggers.Offset.Z);
        TAngle<double>::ToVector((TAngle<double> *)&local_1a0,local_190);
        TVector3<double>::operator+=(&ViewPos,&local_1a0);
      }
      if (((jiggers.RelIntensity.X != 0.0) || (NAN(jiggers.RelIntensity.X))) ||
         ((jiggers.RelOffset.X != 0.0 || (NAN(jiggers.RelOffset.X))))) {
        TAngle<double>::operator+((TAngle<double> *)&power_1,90.0);
        TAngle<double>::operator=((TAngle<double> *)&power,(TAngle<double> *)&power_1);
        local_1b0 = QuakePower(an.Degrees,jiggers.RelIntensity.X,jiggers.RelOffset.X);
        TAngle<double>::ToVector((TAngle<double> *)&lightlist,local_1b0);
        TVector3<double>::operator+=(&ViewPos,(Vector2 *)&lightlist);
      }
      if ((((jiggers.RelIntensity.Y != 0.0) || (NAN(jiggers.RelIntensity.Y))) ||
          (jiggers.RelOffset.Y != 0.0)) || (NAN(jiggers.RelOffset.Y))) {
        dVar10 = QuakePower(an.Degrees,jiggers.RelIntensity.Y,jiggers.RelOffset.Y);
        ViewPos.Z = dVar10 + ViewPos.Z;
      }
      if (((quakefactor != 0.0) || (NAN(quakefactor))) ||
         ((jiggers.RelIntensity.Z != 0.0 || (NAN(jiggers.RelIntensity.Z))))) {
        dVar10 = QuakePower(an.Degrees,quakefactor,jiggers.RelIntensity.Z);
        ViewPos.X = dVar10 + ViewPos.X;
      }
      if (((jiggers.Intensity.X != 0.0) || (NAN(jiggers.Intensity.X))) ||
         ((jiggers.Offset.X != 0.0 || (NAN(jiggers.Offset.X))))) {
        dVar10 = QuakePower(an.Degrees,jiggers.Intensity.X,jiggers.Offset.X);
        ViewPos.Y = dVar10 + ViewPos.Y;
      }
      if ((((jiggers.Intensity.Y != 0.0) || (NAN(jiggers.Intensity.Y))) || (jiggers.Offset.Y != 0.0)
          ) || (NAN(jiggers.Offset.Y))) {
        dVar10 = QuakePower(an.Degrees,jiggers.Intensity.Y,jiggers.Offset.Y);
        ViewPos.Z = dVar10 + ViewPos.Z;
      }
    }
  }
  if (camera->player == (player_t *)0x0) {
    local_21c = 0;
  }
  else {
    local_21c = camera->player->extralight;
  }
  extralight = local_21c;
  iview._4_4_ = 0;
  this = &(viewsector->e->XFloor).lightlist;
  uVar3 = TArray<lightlist_t,_lightlist_t>::Size(this);
  if (uVar3 == 0) {
    psVar8 = sector_t::GetHeightSec(viewsector);
    if (psVar8 != (sector_t_conflict *)0x0) {
      iVar2 = secplane_t::PointOnSide(&psVar8->floorplane,&ViewPos);
      if (iVar2 < 0) {
        local_234 = psVar8->bottommap;
      }
      else {
        iVar2 = secplane_t::PointOnSide(&psVar8->ceilingplane,&ViewPos);
        if (iVar2 < 0) {
          local_238 = psVar8->topmap;
        }
        else {
          local_238 = psVar8->midmap;
        }
        local_234 = local_238;
      }
      iview._4_4_ = local_234;
      if ((local_234 >> 0x18 == 0) && (numfakecmaps <= local_234)) {
        iview._4_4_ = 0;
      }
    }
  }
  else {
    for (plane._4_4_ = 0; uVar3 = TArray<lightlist_t,_lightlist_t>::Size(this), plane._4_4_ < uVar3;
        plane._4_4_ = plane._4_4_ + 1) {
      uVar3 = TArray<lightlist_t,_lightlist_t>::Size(this);
      if (plane._4_4_ < uVar3 - 1) {
        local_230 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)(plane._4_4_ + 1));
      }
      else {
        local_230 = (lightlist_t *)&viewsector->floorplane;
      }
      _blendv = local_230;
      s._4_4_ = secplane_t::PointOnSide(&local_230->plane,&ViewPos);
      dVar10 = secplane_t::fC(&_blendv->plane);
      if (dVar10 < 0.0) {
        s._4_4_ = -s._4_4_;
      }
      if (0 < s._4_4_) {
        plVar7 = TArray<lightlist_t,_lightlist_t>::operator[](this,(ulong)plane._4_4_);
        uVar4 = (plVar7->blend).field_0.d;
        s._3_1_ = (char)(uVar4 >> 0x18);
        bVar1 = s._3_1_ == '\0';
        s._0_4_ = uVar4;
        if ((bVar1) && (uVar4 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&s), uVar4 != 0)
           ) {
          s._0_4_ = CONCAT13(0x80,s._0_3_);
        }
        iview._4_4_ = (uint32)s;
        break;
      }
    }
  }
  if (R_OldBlend != iview._4_4_) {
    R_OldBlend = iview._4_4_;
    if (iview._4_4_ >> 0x18 == 0) {
      NormalLight.Maps = realcolormaps + (iview._4_4_ << 0xd);
      BaseBlendB = 0;
      BaseBlendG = 0;
      BaseBlendR = 0;
      BaseBlendA = 0.0;
    }
    else {
      BaseBlendR = iview._4_4_ >> 0x10 & 0xff;
      BaseBlendG = iview._4_4_ >> 8 & 0xff;
      BaseBlendB = iview._4_4_ & 0xff;
      BaseBlendA = (float)(iview._4_4_ >> 0x18) / 255.0;
      NormalLight.Maps = realcolormaps;
    }
  }
  (*Renderer->_vptr_FRenderer[0x12])();
  (*Renderer->_vptr_FRenderer[0x11])(Renderer,ppStack_18);
  validcount = validcount + 1;
  if (((DFrameBuffer *)RenderTarget == screen) &&
     (iVar2 = FIntCVar::operator_cast_to_int(&r_clearbuffer), iVar2 != 0)) {
    local_1f0 = FIntCVar::operator_cast_to_int(&r_clearbuffer);
    if (local_1f0 == 3) {
      uVar3 = I_FPSTime();
      local_1f0 = (uVar3 >> 7 & 1) + 1;
    }
    if (local_1f0 == 1) {
      local_1ec = (uint)GPalette.BlackIndex;
    }
    else if (local_1f0 == 2) {
      local_1ec = (uint)GPalette.WhiteIndex;
    }
    else if (local_1f0 == 4) {
      uVar3 = I_FPSTime();
      local_1ec = uVar3 >> 5 & 0xff;
    }
    else {
      local_1ec = FRandom::operator()(&pr_hom);
    }
    (*Renderer->_vptr_FRenderer[0xe])(Renderer,(ulong)local_1ec);
  }
  return;
}

Assistant:

void R_SetupFrame (AActor *actor)
{
	if (actor == NULL)
	{
		I_Error ("Tried to render from a NULL actor.");
	}

	player_t *player = actor->player;
	unsigned int newblend;
	InterpolationViewer *iview;
	bool unlinked = false;

	if (player != NULL && player->mo == actor)
	{	// [RH] Use camera instead of viewplayer
		camera = player->camera;
		if (camera == NULL)
		{
			camera = player->camera = player->mo;
		}
	}
	else
	{
		camera = actor;
	}

	if (camera == NULL)
	{
		I_Error ("You lost your body. Bad dehacked work is likely to blame.");
	}

	iview = FindPastViewer (camera);

	int nowtic = I_GetTime (false);
	if (iview->otic != -1 && nowtic > iview->otic)
	{
		iview->otic = nowtic;
		iview->Old = iview->New;
	}

	if (player != NULL && gamestate != GS_TITLELEVEL &&
		((player->cheats & CF_CHASECAM) || (r_deathcamera && camera->health <= 0)))
	{
		sector_t *oldsector = R_PointInSubsector(iview->Old.Pos)->sector;
		// [RH] Use chasecam view
		DVector3 campos;
		DAngle camangle;
		P_AimCamera (camera, campos, camangle, viewsector, unlinked);	// fixme: This needs to translate the angle, too.
		iview->New.Pos = campos;
		iview->New.Angles.Yaw = camangle;
		
		r_showviewer = true;
		// Interpolating this is a very complicated thing because nothing keeps track of the aim camera's movement, so whenever we detect a portal transition
		// it's probably best to just reset the interpolation for this move.
		// Note that this can still cause problems with unusually linked portals
		if (viewsector->PortalGroup != oldsector->PortalGroup || (unlinked && ((iview->New.Pos.XY() - iview->Old.Pos.XY()).LengthSquared()) > 256*256))
		{
			iview->otic = nowtic;
			iview->Old = iview->New;
			r_NoInterpolate = true;
		}
	}
	else
	{
		iview->New.Pos = { camera->Pos().XY(), camera->player ? camera->player->viewz : camera->Z() + camera->GetCameraHeight() };
		viewsector = camera->Sector;
		r_showviewer = false;
	}
	iview->New.Angles = camera->Angles;
	if (camera->player != 0)
	{
		player = camera->player;
	}

	if (iview->otic == -1 || r_NoInterpolate)
	{
		R_ResetViewInterpolation ();
		iview->otic = nowtic;
	}

	r_TicFracF = I_GetTimeFrac (&r_FrameTime);
	if (cl_capfps || r_NoInterpolate)
	{
		r_TicFracF = 1.;
	}
	R_InterpolateView (player, r_TicFracF, iview);

	R_SetViewAngle ();

	interpolator.DoInterpolations (r_TicFracF);

	// Keep the view within the sector's floor and ceiling
	if (viewsector->PortalBlocksMovement(sector_t::ceiling))
	{
		double theZ = viewsector->ceilingplane.ZatPoint(ViewPos) - 4;
		if (ViewPos.Z > theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (viewsector->PortalBlocksMovement(sector_t::floor))
	{
		double theZ = viewsector->floorplane.ZatPoint(ViewPos) + 4;
		if (ViewPos.Z < theZ)
		{
			ViewPos.Z = theZ;
		}
	}

	if (!paused)
	{
		FQuakeJiggers jiggers;

		memset(&jiggers, 0, sizeof(jiggers));
		if (DEarthquake::StaticGetQuakeIntensities(camera, jiggers) > 0)
		{
			double quakefactor = r_quakeintensity;
			DAngle an;

			if (jiggers.RollIntensity != 0 || jiggers.RollWave != 0)
			{
				ViewRoll += QuakePower(quakefactor, jiggers.RollIntensity, jiggers.RollWave);
			}
			if (jiggers.RelIntensity.X != 0 || jiggers.RelOffset.X != 0)
			{
				an = camera->Angles.Yaw;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.X, jiggers.RelOffset.X);
				ViewPos += an.ToVector(power);
			}
			if (jiggers.RelIntensity.Y != 0 || jiggers.RelOffset.Y != 0)
			{
				an = camera->Angles.Yaw + 90;
				double power = QuakePower(quakefactor, jiggers.RelIntensity.Y, jiggers.RelOffset.Y);
				ViewPos += an.ToVector(power);
			}
			// FIXME: Relative Z is not relative
			if (jiggers.RelIntensity.Z != 0 || jiggers.RelOffset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.RelIntensity.Z, jiggers.RelOffset.Z);
			}
			if (jiggers.Intensity.X != 0 || jiggers.Offset.X != 0)
			{
				ViewPos.X += QuakePower(quakefactor, jiggers.Intensity.X, jiggers.Offset.X);
			}
			if (jiggers.Intensity.Y != 0 || jiggers.Offset.Y != 0)
			{
				ViewPos.Y += QuakePower(quakefactor, jiggers.Intensity.Y, jiggers.Offset.Y);
			}
			if (jiggers.Intensity.Z != 0 || jiggers.Offset.Z != 0)
			{
				ViewPos.Z += QuakePower(quakefactor, jiggers.Intensity.Z, jiggers.Offset.Z);
			}
		}
	}

	extralight = camera->player ? camera->player->extralight : 0;

	// killough 3/20/98, 4/4/98: select colormap based on player status
	// [RH] Can also select a blend
	newblend = 0;

	TArray<lightlist_t> &lightlist = viewsector->e->XFloor.lightlist;
	if (lightlist.Size() > 0)
	{
		for(unsigned int i = 0; i < lightlist.Size(); i++)
		{
			secplane_t *plane;
			int viewside;
			plane = (i < lightlist.Size()-1) ? &lightlist[i+1].plane : &viewsector->floorplane;
			viewside = plane->PointOnSide(ViewPos);
			// Reverse the direction of the test if the plane was downward facing.
			// We want to know if the view is above it, whatever its orientation may be.
			if (plane->fC() < 0)
				viewside = -viewside;
			if (viewside > 0)
			{
				// 3d floor 'fog' is rendered as a blending value
				PalEntry blendv = lightlist[i].blend;

				// If no alpha is set, use 50%
				if (blendv.a==0 && blendv!=0) blendv.a=128;
				newblend = blendv.d;
				break;
			}
		}
	}
	else
	{
		const sector_t *s = viewsector->GetHeightSec();
		if (s != NULL)
		{
			newblend = s->floorplane.PointOnSide(ViewPos) < 0
				? s->bottommap
				: s->ceilingplane.PointOnSide(ViewPos) < 0
				? s->topmap
				: s->midmap;
			if (APART(newblend) == 0 && newblend >= numfakecmaps)
				newblend = 0;
		}
	}

	// [RH] Don't override testblend unless entering a sector with a
	//		blend different from the previous sector's. Same goes with
	//		NormalLight's maps pointer.
	if (R_OldBlend != newblend)
	{
		R_OldBlend = newblend;
		if (APART(newblend))
		{
			BaseBlendR = RPART(newblend);
			BaseBlendG = GPART(newblend);
			BaseBlendB = BPART(newblend);
			BaseBlendA = APART(newblend) / 255.f;
			NormalLight.Maps = realcolormaps;
		}
		else
		{
			NormalLight.Maps = realcolormaps + NUMCOLORMAPS*256*newblend;
			BaseBlendR = BaseBlendG = BaseBlendB = 0;
			BaseBlendA = 0.f;
		}
	}

	Renderer->CopyStackedViewParameters();
	Renderer->SetupFrame(player);

	validcount++;

	if (RenderTarget == screen && r_clearbuffer != 0)
	{
		int color;
		int hom = r_clearbuffer;

		if (hom == 3)
		{
			hom = ((I_FPSTime() / 128) & 1) + 1;
		}
		if (hom == 1)
		{
			color = GPalette.BlackIndex;
		}
		else if (hom == 2)
		{
			color = GPalette.WhiteIndex;
		}
		else if (hom == 4)
		{
			color = (I_FPSTime() / 32) & 255;
		}
		else
		{
			color = pr_hom();
		}
		Renderer->ClearBuffer(color);
	}
}